

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall
CLI::App::_parse_positional
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool haltOnSubcommand)

{
  pointer pbVar1;
  pointer puVar2;
  pointer pcVar3;
  pointer psVar4;
  size_type sVar5;
  bool bVar6;
  size_t sVar7;
  App *pAVar8;
  pointer pbVar9;
  ExtrasError *this_00;
  undefined7 in_register_00000011;
  pointer puVar10;
  pointer psVar11;
  Option *pOVar12;
  string pos;
  string local_d0;
  undefined4 local_ac;
  string local_a8;
  string local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_ac = (undefined4)CONCAT71(in_register_00000011,haltOnSubcommand);
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((this->positionals_at_end_ == true) &&
     (pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     sVar7 = _count_remaining_positionals(this,true),
     (ulong)((long)pbVar9 - (long)pbVar1 >> 5) <= sVar7)) {
    puVar10 = (this->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar10 != puVar2) {
      do {
        pOVar12 = (puVar10->_M_t).
                  super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                  super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                  super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        if ((((pOVar12->pname_)._M_string_length != 0) &&
            ((pOVar12->super_OptionBase<CLI::Option>).required_ == true)) &&
           ((int)((ulong)((long)*(pointer *)
                                 ((long)&(pOVar12->results_).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 + 8) -
                         *(long *)&(pOVar12->results_).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data) >> 5) <
            pOVar12->expected_min_ * pOVar12->type_size_min_)) {
          if (this->validate_positionals_ == true) {
            pcVar3 = pbVar9[-1]._M_dataplus._M_p;
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,pcVar3,pcVar3 + pbVar9[-1]._M_string_length);
            Option::_validate(&local_a8,
                              (puVar10->_M_t).
                              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                              .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_d0,0)
            ;
            ::std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            sVar5 = local_d0._M_string_length;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if (sVar5 != 0) goto LAB_00123db9;
            pOVar12 = (puVar10->_M_t).
                      super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                      super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                      super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          }
          pcVar3 = pbVar9[-1]._M_dataplus._M_p;
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_68,pcVar3,pcVar3 + pbVar9[-1]._M_string_length);
          Option::_add_result(pOVar12,&local_68,&pOVar12->results_);
          pOVar12->current_option_state_ = parsing;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          local_d0._M_dataplus._M_p =
               (pointer)(puVar10->_M_t).
                        super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                        super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                        super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                    ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                     (Option **)&local_d0);
          pbVar9 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pbVar9 + -1;
          goto LAB_001240e2;
        }
LAB_00123db9:
        puVar10 = puVar10 + 1;
      } while (puVar10 != puVar2);
    }
  }
  puVar10 = (this->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 != puVar2) {
    do {
      pOVar12 = (puVar10->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if (((pOVar12->pname_)._M_string_length != 0) &&
         (((int)((ulong)((long)*(pointer *)
                                ((long)&(pOVar12->results_).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                + 8) -
                        *(long *)&(pOVar12->results_).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data) >> 5) <
           pOVar12->expected_min_ * pOVar12->type_size_min_ || (pOVar12->allow_extra_args_ == true))
         )) {
        if (this->validate_positionals_ != true) {
LAB_0012405a:
          pcVar3 = pbVar9[-1]._M_dataplus._M_p;
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_88,pcVar3,pcVar3 + pbVar9[-1]._M_string_length);
          Option::_add_result(pOVar12,&local_88,&pOVar12->results_);
          pOVar12->current_option_state_ = parsing;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          local_d0._M_dataplus._M_p =
               (pointer)(puVar10->_M_t).
                        super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                        super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                        super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                    ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                     (Option **)&local_d0);
          pbVar9 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pbVar9 + -1;
LAB_001240e2:
          pcVar3 = pbVar9[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != &pbVar9[-1].field_2) {
            operator_delete(pcVar3,pbVar9[-1].field_2._M_allocated_capacity + 1);
            return true;
          }
          return true;
        }
        pcVar3 = pbVar9[-1]._M_dataplus._M_p;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,pcVar3,pcVar3 + pbVar9[-1]._M_string_length);
        Option::_validate(&local_a8,
                          (puVar10->_M_t).
                          super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t
                          .super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                          super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_d0,0);
        ::std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        sVar5 = local_d0._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if (sVar5 == 0) {
          pOVar12 = (puVar10->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          goto LAB_0012405a;
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar2);
  }
  psVar4 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar11 = (this->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar4; psVar11 = psVar11 + 1
      ) {
    pAVar8 = (psVar11->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((((pAVar8->name_)._M_string_length == 0) && (pAVar8->disabled_ == false)) &&
       (bVar6 = _parse_positional(pAVar8,args,false), bVar6)) {
      pAVar8 = (psVar11->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (pAVar8->pre_parse_called_ == false) {
        _trigger_pre_parse(pAVar8,(long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5);
        return true;
      }
      return true;
    }
  }
  if ((this->parent_ != (App *)0x0) && (this->fallthrough_ == true)) {
    pAVar8 = _get_fallthrough_parent(this);
    bVar6 = _parse_positional(pAVar8,args,
                              (this->parse_complete_callback_).super__Function_base._M_manager !=
                              (_Manager_type)0x0);
    return bVar6;
  }
  pAVar8 = _find_subcommand(this,(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + -1,true,false);
  if ((pAVar8 == (App *)0x0) ||
     ((this->require_subcommand_max_ != 0 &&
      (this->require_subcommand_max_ <=
       (ulong)((long)(this->parsed_subcommands_).
                     super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->parsed_subcommands_).
                     super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3))))) {
    pAVar8 = this;
    if (this->parent_ != (App *)0x0) {
      pAVar8 = _get_fallthrough_parent(this);
    }
    pAVar8 = _find_subcommand(pAVar8,(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish + -1,true,false);
    if (pAVar8 != (App *)0x0) {
      pAVar8 = pAVar8->parent_;
      if (pAVar8->require_subcommand_max_ == 0) {
        return false;
      }
      if ((ulong)((long)(pAVar8->parsed_subcommands_).
                        super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pAVar8->parsed_subcommands_).
                        super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) < pAVar8->require_subcommand_max_) {
        return false;
      }
    }
    if (this->positionals_at_end_ == true) {
      this_00 = (ExtrasError *)__cxa_allocate_exception(0x38);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,args);
      ExtrasError::ExtrasError(this_00,&this->name_,&local_48);
      __cxa_throw(this_00,&ExtrasError::typeinfo,Error::~Error);
    }
    if ((this->parent_ == (App *)0x0) || ((this->name_)._M_string_length != 0)) {
      _move_to_missing(this,NONE,pbVar9 + -1);
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar9 + -1;
      pcVar3 = pbVar9[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &pbVar9[-1].field_2) {
        operator_delete(pcVar3,pbVar9[-1].field_2._M_allocated_capacity + 1);
      }
      if (this->prefix_command_ == true) {
        do {
          pbVar9 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          do {
            if ((args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start == pbVar9) {
              return true;
            }
            _move_to_missing(this,NONE,pbVar9 + -1);
            pbVar1 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            pbVar9 = pbVar1 + -1;
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish = pbVar9;
            pcVar3 = pbVar1[-1]._M_dataplus._M_p;
          } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pcVar3 == &pbVar1[-1].field_2);
          operator_delete(pcVar3,pbVar1[-1].field_2._M_allocated_capacity + 1);
        } while( true );
      }
      return true;
    }
  }
  else if ((char)local_ac == '\0') {
    pbVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    (args->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar9 + -1;
    pcVar3 = pbVar9[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &pbVar9[-1].field_2) {
      operator_delete(pcVar3,pbVar9[-1].field_2._M_allocated_capacity + 1);
    }
    _parse(pAVar8,args);
    return true;
  }
  return false;
}

Assistant:

bool _parse_positional(std::vector<std::string> &args, bool haltOnSubcommand) {

        const std::string &positional = args.back();

        if(positionals_at_end_) {
            // deal with the case of required arguments at the end which should take precedence over other arguments
            auto arg_rem = args.size();
            auto remreq = _count_remaining_positionals(true);
            if(arg_rem <= remreq) {
                for(const Option_p &opt : options_) {
                    if(opt->get_positional() && opt->required_) {
                        if(static_cast<int>(opt->count()) < opt->get_items_expected_min()) {
                            if(validate_positionals_) {
                                std::string pos = positional;
                                pos = opt->_validate(pos, 0);
                                if(!pos.empty()) {
                                    continue;
                                }
                            }
                            opt->add_result(positional);
                            parse_order_.push_back(opt.get());
                            args.pop_back();
                            return true;
                        }
                    }
                }
            }
        }
        for(const Option_p &opt : options_) {
            // Eat options, one by one, until done
            if(opt->get_positional() &&
               (static_cast<int>(opt->count()) < opt->get_items_expected_min() || opt->get_allow_extra_args())) {
                if(validate_positionals_) {
                    std::string pos = positional;
                    pos = opt->_validate(pos, 0);
                    if(!pos.empty()) {
                        continue;
                    }
                }
                opt->add_result(positional);
                parse_order_.push_back(opt.get());
                args.pop_back();
                return true;
            }
        }

        for(auto &subc : subcommands_) {
            if((subc->name_.empty()) && (!subc->disabled_)) {
                if(subc->_parse_positional(args, false)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }
        // let the parent deal with it if possible
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_positional(args, static_cast<bool>(parse_complete_callback_));

        /// Try to find a local subcommand that is repeated
        auto com = _find_subcommand(args.back(), true, false);
        if(com != nullptr && (require_subcommand_max_ == 0 || require_subcommand_max_ > parsed_subcommands_.size())) {
            if(haltOnSubcommand) {
                return false;
            }
            args.pop_back();
            com->_parse(args);
            return true;
        }
        /// now try one last gasp at subcommands that have been executed before, go to root app and try to find a
        /// subcommand in a broader way, if one exists let the parent deal with it
        auto parent_app = (parent_ != nullptr) ? _get_fallthrough_parent() : this;
        com = parent_app->_find_subcommand(args.back(), true, false);
        if(com != nullptr && (com->parent_->require_subcommand_max_ == 0 ||
                              com->parent_->require_subcommand_max_ > com->parent_->parsed_subcommands_.size())) {
            return false;
        }

        if(positionals_at_end_) {
            throw CLI::ExtrasError(name_, args);
        }
        /// If this is an option group don't deal with it
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }
        /// We are out of other options this goes to missing
        _move_to_missing(detail::Classifier::NONE, positional);
        args.pop_back();
        if(prefix_command_) {
            while(!args.empty()) {
                _move_to_missing(detail::Classifier::NONE, args.back());
                args.pop_back();
            }
        }

        return true;
    }